

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
          (DrawIndirectBase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferTest,
          uint widthTest,uint heightTest,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferRef,
          uint widthRef,uint heightRef)

{
  pointer pVVar1;
  ostringstream *this_00;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined1 local_348 [16];
  undefined1 local_338 [384];
  undefined1 local_1b8 [384];
  long local_38;
  
  lVar4 = (**(code **)(*(long *)this + 0x20))();
  if (heightTest != 0) {
    auVar2._4_4_ = (float)(int)(float)(*(int *)(lVar4 + 0xc) * 0x800000 + 0x3f800000);
    auVar2._0_4_ = (float)(int)(float)(*(int *)(lVar4 + 8) * 0x800000 + 0x3f800000);
    auVar2._8_4_ = (float)(int)(float)(*(int *)(lVar4 + 0x10) * 0x800000 + 0x3f800000);
    auVar2._12_4_ = (float)(int)(float)(*(int *)(lVar4 + 0x14) * 0x800000 + 0x3f800000);
    local_348 = divps(_DAT_01a25ce0,auVar2);
    uVar6 = 0;
    do {
      if (widthTest != 0) {
        uVar5 = 0;
        do {
          uVar8 = uVar6 * widthTest + (int)uVar5;
          pVVar1 = (bufferTest->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar8;
          local_358 = *(undefined8 *)pVVar1->m_data;
          uStack_350 = *(undefined8 *)(pVVar1->m_data + 2);
          uVar9 = (int)((double)(uVar5 & 0xffffffff) * ((double)widthRef / (double)widthTest) + 0.5)
                  + (int)((double)uVar6 * ((double)heightRef / (double)heightTest) + 0.5) * widthRef
          ;
          pVVar1 = (bufferRef->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar9;
          local_368 = *(undefined8 *)pVVar1->m_data;
          uStack_360 = *(undefined8 *)(pVVar1->m_data + 2);
          if (local_348._0_4_ < ABS((float)local_368 - (float)local_358)) {
LAB_00b8237b:
            local_1b8[0] = false;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            this_00 = (ostringstream *)(local_338 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            DILogger::operator<<((DILogger *)local_338,(char (*) [9])"(x,y)= (");
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cb9541);
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            }
            if (((byte)local_338[0] & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"). Color RGBA(",0xe);
            }
            if (((byte)local_338[0] & 1) == 0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar8].m_data[0]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cb9541);
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar8].m_data[1]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cb9541);
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar8].m_data[2]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cb9541);
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar8].m_data[3]);
            }
            if (((byte)local_338[0] & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,") is different than expected RGBA(",0x22);
            }
            if (((byte)local_338[0] & 1) == 0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar9].m_data[0]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cb9541);
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar9].m_data[1]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cb9541);
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar9].m_data[2]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cb9541);
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar9].m_data[3]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1adddc7);
            glcts::anon_unknown_0::DILogger::~DILogger((DILogger *)local_338);
            lVar4 = local_38;
            glcts::anon_unknown_0::DILogger::~DILogger((DILogger *)local_1b8);
            return lVar4;
          }
          uVar3 = 0;
          do {
            uVar7 = uVar3;
            if (uVar7 == 2) goto LAB_00b8235c;
            fVar10 = ABS(*(float *)((long)&local_368 + uVar7 * 4 + 4) -
                         *(float *)((long)&local_358 + uVar7 * 4 + 4));
            uVar3 = uVar7 + 1;
          } while (fVar10 < *(float *)(local_348 + uVar7 * 4 + 4) ||
                   fVar10 == *(float *)(local_348 + uVar7 * 4 + 4));
          if (uVar7 < 2) goto LAB_00b8237b;
LAB_00b8235c:
          uVar5 = uVar5 + 1;
        } while (uVar5 != widthTest);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != heightTest);
  }
  return 0;
}

Assistant:

long BuffersCompare(const std::vector<T>& bufferTest, unsigned int widthTest, unsigned int heightTest,
						const std::vector<T>& bufferRef, unsigned int widthRef, unsigned int heightRef)
	{

		const tcu::PixelFormat& pixelFormat = m_context.getRenderContext().getRenderTarget().getPixelFormat();
		tcu::Vec4				epsilon		= tcu::Vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		double stepX = widthRef / static_cast<double>(widthTest);
		double stepY = heightRef / static_cast<double>(heightTest);
		for (unsigned int i = 0; i < heightTest; ++i)
		{
			unsigned int offsetTest = i * widthTest;
			unsigned int offsetRef  = static_cast<int>(i * stepY + 0.5) * widthRef;
			for (unsigned int j = 0; j < widthTest; ++j)
			{
				unsigned int posXRef = static_cast<int>(j * stepX + 0.5);
				if (!ColorVerify(bufferTest[j + offsetTest], bufferRef[posXRef + offsetRef], epsilon))
				{
					DIResult status;
					status.error() << "(x,y)= (" << j << "," << i << "). Color RGBA(" << bufferTest[j + offsetTest][0]
								   << "," << bufferTest[j + offsetTest][1] << "," << bufferTest[j + offsetTest][2]
								   << "," << bufferTest[j + offsetTest][3] << ") is different than expected RGBA("
								   << bufferRef[posXRef + offsetRef][0] << "," << bufferRef[posXRef + offsetRef][1]
								   << "," << bufferRef[posXRef + offsetRef][2] << ","
								   << bufferRef[posXRef + offsetRef][3] << ")";
					return status.code();
				}
			}
		}
		return NO_ERROR;
	}